

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superres_scale.c
# Opt level: O2

int av1_superres_in_recode_allowed(AV1_COMP *cpi)

{
  uint uVar1;
  
  uVar1 = 0;
  if (((cpi->oxcf).superres_cfg.superres_mode == AOM_SUPERRES_AUTO) &&
     ((cpi->sf).hl_sf.superres_auto_search_type != '\x02')) {
    uVar1 = (uint)(1 < (cpi->rc).frames_to_key);
  }
  return uVar1;
}

Assistant:

int av1_superres_in_recode_allowed(const AV1_COMP *const cpi) {
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  // Empirically found to not be beneficial for image coding.
  return oxcf->superres_cfg.superres_mode == AOM_SUPERRES_AUTO &&
         cpi->sf.hl_sf.superres_auto_search_type != SUPERRES_AUTO_SOLO &&
         cpi->rc.frames_to_key > 1;
}